

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

Config * __thiscall QPDFJob::Config::jsonOutput(Config *this,string *parameter)

{
  element_type *peVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  json_output = true;
  json(this,parameter);
  peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->json_stream_data_set == false) {
    peVar1->json_stream_data = qpdf_sj_inline;
  }
  if (peVar1->decode_level_set == false) {
    peVar1->decode_level = qpdf_dl_none;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"qpdf","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&peVar1->json_keys,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::jsonOutput(std::string const& parameter)
{
    o.m->json_output = true;
    json(parameter);
    if (!o.m->json_stream_data_set) {
        // No need to set json_stream_data_set -- that indicates explicit use of --json-stream-data.
        o.m->json_stream_data = qpdf_sj_inline;
    }
    if (!o.m->decode_level_set) {
        o.m->decode_level = qpdf_dl_none;
    }
    o.m->json_keys.insert("qpdf");
    return this;
}